

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

breakpoint_id __thiscall
cmDebugger_impl::SetBreakpoint(cmDebugger_impl *this,string *fileName,size_t line)

{
  breakpoint_id bVar1;
  int iVar2;
  size_t nextId;
  breakpoint_id local_28;
  size_t local_20;
  
  local_20 = line;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar2 == 0) {
    local_28 = this->nextBreakId;
    this->nextBreakId = local_28 + 1;
    std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>::
    emplace_back<unsigned_long&,std::__cxx11::string_const&,unsigned_long&>
              ((vector<cmBreakpoint,std::allocator<cmBreakpoint>> *)&this->breakpoints,&local_28,
               fileName,&local_20);
    bVar1 = local_28;
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

breakpoint_id SetBreakpoint(const std::string& fileName,
                              size_t line) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto nextId = nextBreakId++;
    breakpoints.emplace_back(nextId, fileName, line);
    return nextId;
  }